

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testCopyMultiPartFile.cpp
# Opt level: O1

void anon_unknown.dwarf_22493e::setInputFrameBuffer
               (FrameBuffer *frameBuffer,int pixelType,Array2D<unsigned_int> *uData,
               Array2D<float> *fData,Array2D<Imath_3_2::half> *hData,int width,int height)

{
  ulong uVar1;
  uint *puVar2;
  float *pfVar3;
  half *phVar4;
  char *pcVar5;
  long lVar6;
  long lVar7;
  Slice local_68 [56];
  
  if (pixelType == 2) {
    lVar6 = (long)width;
    lVar7 = height * lVar6;
    uVar1 = 0xffffffffffffffff;
    if (-1 < lVar7) {
      uVar1 = lVar7 * 2;
    }
    phVar4 = (half *)operator_new__(uVar1);
    if (hData->_data != (half *)0x0) {
      operator_delete__(hData->_data);
    }
    hData->_sizeX = (long)height;
    hData->_sizeY = lVar6;
    hData->_data = phVar4;
    Imf_3_2::Slice::Slice(local_68,HALF,(char *)phVar4,2,lVar6 * 2,1,1,0.0,false,false);
    pcVar5 = "HALF";
  }
  else if (pixelType == 1) {
    lVar7 = (long)width;
    uVar1 = height * lVar7;
    pfVar3 = (float *)operator_new__(-(ulong)(uVar1 >> 0x3e != 0) | uVar1 * 4);
    if (fData->_data != (float *)0x0) {
      operator_delete__(fData->_data);
    }
    fData->_sizeX = (long)height;
    fData->_sizeY = lVar7;
    fData->_data = pfVar3;
    Imf_3_2::Slice::Slice(local_68,FLOAT,(char *)pfVar3,4,lVar7 << 2,1,1,0.0,false,false);
    pcVar5 = "FLOAT";
  }
  else {
    if (pixelType != 0) {
      return;
    }
    lVar7 = (long)width;
    uVar1 = height * lVar7;
    puVar2 = (uint *)operator_new__(-(ulong)(uVar1 >> 0x3e != 0) | uVar1 * 4);
    if (uData->_data != (uint *)0x0) {
      operator_delete__(uData->_data);
    }
    uData->_sizeX = (long)height;
    uData->_sizeY = lVar7;
    uData->_data = puVar2;
    Imf_3_2::Slice::Slice(local_68,UINT,(char *)puVar2,4,lVar7 << 2,1,1,0.0,false,false);
    pcVar5 = "UINT";
  }
  Imf_3_2::FrameBuffer::insert((char *)frameBuffer,(Slice *)pcVar5);
  return;
}

Assistant:

void
setInputFrameBuffer (
    FrameBuffer&           frameBuffer,
    int                    pixelType,
    Array2D<unsigned int>& uData,
    Array2D<float>&        fData,
    Array2D<half>&         hData,
    int                    width,
    int                    height)
{
    switch (pixelType)
    {
        case 0:
            uData.resizeErase (height, width);
            frameBuffer.insert (
                "UINT",
                Slice (
                    IMF::UINT,
                    (char*) (&uData[0][0]),
                    sizeof (uData[0][0]) * 1,
                    sizeof (uData[0][0]) * width,
                    1,
                    1,
                    0));
            break;
        case 1:
            fData.resizeErase (height, width);
            frameBuffer.insert (
                "FLOAT",
                Slice (
                    IMF::FLOAT,
                    (char*) (&fData[0][0]),
                    sizeof (fData[0][0]) * 1,
                    sizeof (fData[0][0]) * width,
                    1,
                    1,
                    0));
            break;
        case 2:
            hData.resizeErase (height, width);
            frameBuffer.insert (
                "HALF",
                Slice (
                    IMF::HALF,
                    (char*) (&hData[0][0]),
                    sizeof (hData[0][0]) * 1,
                    sizeof (hData[0][0]) * width,
                    1,
                    1,
                    0));
            break;
    }
}